

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *ilimit_w;
  long *iEnd;
  long *iStart;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  U32 h;
  ZSTD_longLengthType_e ZVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  int *op;
  uint uVar11;
  int iVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  seqDef *psVar20;
  byte bVar21;
  byte bVar22;
  long *plVar23;
  U32 UVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  BYTE *pBVar29;
  U16 UVar30;
  U32 UVar31;
  BYTE *pBVar32;
  BYTE *pBVar33;
  U32 UVar34;
  uint uVar35;
  BYTE *litEnd;
  long *plVar36;
  int iVar37;
  long *plVar38;
  long *plVar39;
  ulong uVar40;
  long *plVar41;
  uint local_104;
  BYTE *litLimit_w;
  
  iEnd = (long *)((long)src + srcSize);
  pBVar7 = (ms->window).base;
  iVar28 = (int)pBVar7;
  iVar37 = (int)iEnd - iVar28;
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar5 = (ms->window).lowLimit;
  uVar11 = iVar37 - uVar14;
  if (iVar37 - uVar5 <= uVar14) {
    uVar11 = uVar5;
  }
  if (ms->loadedDictEnd != 0) {
    uVar11 = uVar5;
  }
  uVar5 = (ms->window).dictLimit;
  if (uVar5 <= uVar11) {
    sVar18 = ZSTD_compressBlock_doubleFast(ms,seqStore,rep,src,srcSize);
    return sVar18;
  }
  pUVar8 = ms->hashTable;
  uVar14 = (ms->cParams).hashLog;
  pUVar9 = ms->chainTable;
  h = (ms->cParams).chainLog;
  plVar3 = (long *)((long)src + (srcSize - 8));
  pBVar10 = (ms->window).dictBase;
  iStart = (long *)(pBVar7 + uVar5);
  plVar1 = (long *)(pBVar10 + uVar11);
  plVar2 = (long *)(pBVar10 + uVar5);
  local_104 = *rep;
  UVar31 = rep[1];
  bVar21 = 0x40 - (char)h;
  bVar22 = 0x20 - (char)h;
  ilimit_w = iEnd + -4;
  plVar23 = (long *)src;
LAB_0018646e:
  do {
    if (plVar3 <= src) {
      *rep = local_104;
      rep[1] = UVar31;
      return (long)iEnd - (long)plVar23;
    }
    if (0x20 < h) goto LAB_0018723f;
    uVar25 = (ulong)(mls - 5);
    switch(uVar25) {
    case 0:
      uVar40 = *src * -0x30e4432345000000;
      goto LAB_001864e3;
    case 1:
      sVar18 = ZSTD_hash6Ptr(src,h);
      break;
    case 2:
      uVar40 = *src * -0x30e44323405a9d00;
LAB_001864e3:
      sVar18 = uVar40 >> (bVar21 & 0x3f);
      break;
    case 3:
      sVar18 = ZSTD_hash8Ptr(src,h);
      break;
    default:
      sVar18 = (size_t)((uint)((int)*src * -0x61c8864f) >> (bVar22 & 0x1f));
    }
    uVar35 = pUVar9[sVar18];
    pBVar29 = pBVar7;
    if (uVar35 < uVar5) {
      pBVar29 = pBVar10;
    }
    if (0x20 < uVar14) {
LAB_0018723f:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    sVar17 = ZSTD_hash8Ptr(src,uVar14);
    uVar16 = pUVar8[sVar17];
    pBVar33 = pBVar7;
    if (uVar16 < uVar5) {
      pBVar33 = pBVar10;
    }
    UVar34 = (int)src - iVar28;
    UVar24 = UVar34 + 1;
    pUVar8[sVar17] = UVar34;
    pUVar9[sVar18] = UVar34;
    if ((UVar24 - uVar11 < local_104) || (uVar15 = UVar24 - local_104, (uVar5 - 1) - uVar15 < 3)) {
LAB_001865ea:
      if ((uVar11 < uVar16) && (plVar38 = (long *)(pBVar33 + uVar16), *plVar38 == *src)) {
        plVar36 = iStart;
        plVar39 = iEnd;
        if (uVar16 < uVar5) {
          plVar36 = plVar1;
          plVar39 = plVar2;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 8),(BYTE *)(plVar38 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar39,(BYTE *)iStart);
        uVar16 = UVar34 - uVar16;
        for (lVar27 = 0;
            ((plVar39 = (long *)((long)src + lVar27), plVar36 < (long *)((long)plVar38 + lVar27) &&
             (plVar23 < plVar39)) &&
            (*(char *)((long)src + lVar27 + -1) == *(char *)((long)plVar38 + lVar27 + -1)));
            lVar27 = lVar27 + -1) {
        }
        if (uVar16 == 0) {
          __assert_fail("(offset)>0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6f4f,
                        "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0018725e:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001872da:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar40 = (long)src + (lVar27 - (long)plVar23);
        plVar38 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar38 + uVar40)) {
LAB_0018729c:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        plVar36 = (long *)(uVar40 + (long)plVar23);
        if (iEnd < plVar36) {
LAB_001872bb:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < plVar36) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)plVar23,(BYTE *)plVar36,(BYTE *)ilimit_w);
LAB_0018685f:
          seqStore->lit = seqStore->lit + (long)src + (lVar27 - (long)plVar23);
          if (0xffff < uVar40) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00187318:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar26 = plVar23[1];
          *plVar38 = *plVar23;
          plVar38[1] = lVar26;
          pBVar29 = seqStore->lit;
          if (0x10 < uVar40) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar29 + 0x10) + (-0x10 - (long)(plVar23 + 2)))
               ) {
LAB_00187375:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            lVar26 = plVar23[3];
            *(long *)(pBVar29 + 0x10) = plVar23[2];
            *(long *)(pBVar29 + 0x18) = lVar26;
            if (0x20 < (long)uVar40) {
              lVar26 = 0;
              do {
                puVar4 = (undefined8 *)((long)plVar23 + lVar26 + 0x20);
                uVar13 = puVar4[1];
                pBVar33 = pBVar29 + lVar26 + 0x20;
                *(undefined8 *)pBVar33 = *puVar4;
                *(undefined8 *)(pBVar33 + 8) = uVar13;
                puVar4 = (undefined8 *)((long)plVar23 + lVar26 + 0x30);
                uVar13 = puVar4[1];
                *(undefined8 *)(pBVar33 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar33 + 0x18) = uVar13;
                lVar26 = lVar26 + 0x20;
              } while (pBVar33 + 0x20 < pBVar29 + uVar40);
            }
            goto LAB_0018685f;
          }
          seqStore->lit = pBVar29 + uVar40;
        }
        uVar19 = (sVar18 - lVar27) + 8;
        psVar20 = seqStore->sequences;
        psVar20->litLength = (short)lVar27 + ((short)src - (short)plVar23);
        psVar20->offBase = uVar16 + 3;
        if (uVar19 < 3) {
LAB_0018727d:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar40 = (sVar18 - lVar27) + 5;
        UVar31 = local_104;
        if (0xffff < uVar40) {
          ZVar6 = seqStore->longLengthType;
          goto joined_r0x00186c08;
        }
      }
      else {
        if ((uVar35 <= uVar11) || (plVar38 = (long *)(pBVar29 + uVar35), (int)*plVar38 != (int)*src)
           ) {
          src = (void *)((long)src + ((long)src - (long)plVar23 >> 8) + 1);
          goto LAB_0018646e;
        }
        plVar39 = (long *)((long)src + 1);
        sVar18 = ZSTD_hash8Ptr(plVar39,uVar14);
        uVar16 = pUVar8[sVar18];
        pBVar29 = pBVar7;
        if (uVar16 < uVar5) {
          pBVar29 = pBVar10;
        }
        pUVar8[sVar18] = UVar24;
        if ((uVar11 < uVar16) && (plVar36 = (long *)(pBVar29 + uVar16), *plVar36 == *plVar39)) {
          plVar41 = iStart;
          plVar38 = iEnd;
          if (uVar16 < uVar5) {
            plVar41 = plVar1;
            plVar38 = plVar2;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 9),(BYTE *)(plVar36 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar38,(BYTE *)iStart);
          uVar19 = sVar18 + 8;
          uVar16 = UVar24 - uVar16;
          for (; ((plVar41 < plVar36 && (plVar23 < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar36 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar36 = (long *)((long)plVar36 + -1);
            uVar19 = uVar19 + 1;
          }
        }
        else {
          plVar36 = iStart;
          plVar39 = iEnd;
          if (uVar35 < uVar5) {
            plVar36 = plVar1;
            plVar39 = plVar2;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)plVar38 + 4),(BYTE *)iEnd,
                              (BYTE *)plVar39,(BYTE *)iStart);
          uVar19 = sVar18 + 4;
          uVar16 = UVar34 - uVar35;
          for (; ((plVar39 = (long *)src, plVar36 < plVar38 && (plVar23 < src)) &&
                 (*(BYTE *)((long)src + -1) == *(BYTE *)((long)plVar38 + -1)));
              src = (void *)((long)src + -1)) {
            plVar38 = (long *)((long)plVar38 + -1);
            uVar19 = uVar19 + 1;
          }
        }
        if (uVar16 == 0) {
          __assert_fail("(offset)>0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6f68,
                        "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0018725e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001872da;
        uVar40 = (long)plVar39 - (long)plVar23;
        plVar38 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar38 + uVar40))
        goto LAB_0018729c;
        if (iEnd < plVar39) goto LAB_001872bb;
        if (ilimit_w < plVar39) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)plVar23,(BYTE *)plVar39,(BYTE *)ilimit_w);
LAB_00186cae:
          seqStore->lit = seqStore->lit + uVar40;
          if (0xffff < uVar40) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00187318;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar27 = plVar23[1];
          *plVar38 = *plVar23;
          plVar38[1] = lVar27;
          pBVar29 = seqStore->lit;
          if (0x10 < uVar40) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar29 + 0x10) + (-0x10 - (long)(plVar23 + 2)))
               ) goto LAB_00187375;
            lVar27 = plVar23[3];
            *(long *)(pBVar29 + 0x10) = plVar23[2];
            *(long *)(pBVar29 + 0x18) = lVar27;
            if (0x20 < (long)uVar40) {
              lVar27 = 0;
              do {
                puVar4 = (undefined8 *)((long)plVar23 + lVar27 + 0x20);
                uVar13 = puVar4[1];
                pBVar33 = pBVar29 + lVar27 + 0x20;
                *(undefined8 *)pBVar33 = *puVar4;
                *(undefined8 *)(pBVar33 + 8) = uVar13;
                puVar4 = (undefined8 *)((long)plVar23 + lVar27 + 0x30);
                uVar13 = puVar4[1];
                *(undefined8 *)(pBVar33 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar33 + 0x18) = uVar13;
                lVar27 = lVar27 + 0x20;
              } while (pBVar33 + 0x20 < pBVar29 + uVar40);
            }
            goto LAB_00186cae;
          }
          seqStore->lit = pBVar29 + uVar40;
        }
        psVar20 = seqStore->sequences;
        psVar20->litLength = (U16)uVar40;
        psVar20->offBase = uVar16 + 3;
        if (uVar19 < 3) goto LAB_0018727d;
        uVar40 = uVar19 - 3;
        UVar31 = local_104;
        if (0xffff < uVar40) {
          ZVar6 = seqStore->longLengthType;
          goto joined_r0x00186c08;
        }
      }
LAB_00186de4:
      local_104 = uVar16;
      UVar30 = (U16)uVar40;
    }
    else {
      pBVar32 = pBVar7;
      if (uVar15 < uVar5) {
        pBVar32 = pBVar10;
      }
      if (*(int *)(pBVar32 + uVar15) != *(int *)((long)src + 1)) goto LAB_001865ea;
      plVar39 = iEnd;
      if (uVar15 < uVar5) {
        plVar39 = plVar2;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 5),pBVar32 + (ulong)uVar15 + 4,(BYTE *)iEnd,
                          (BYTE *)plVar39,(BYTE *)iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_0018725e;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001872da;
      plVar39 = (long *)((long)src + 1);
      uVar40 = (long)plVar39 - (long)plVar23;
      plVar38 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar38 + uVar40))
      goto LAB_0018729c;
      if (iEnd < plVar39) goto LAB_001872bb;
      if (ilimit_w < plVar39) {
        ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)plVar23,(BYTE *)plVar39,(BYTE *)ilimit_w);
LAB_00186703:
        seqStore->lit = seqStore->lit + uVar40;
        if (0xffff < uVar40) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00187318;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = plVar23[1];
        *plVar38 = *plVar23;
        plVar38[1] = lVar27;
        pBVar29 = seqStore->lit;
        if (0x10 < uVar40) {
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar29 + 0x10) + (-0x10 - (long)(plVar23 + 2))))
          goto LAB_00187375;
          lVar27 = plVar23[3];
          *(long *)(pBVar29 + 0x10) = plVar23[2];
          *(long *)(pBVar29 + 0x18) = lVar27;
          if (0x20 < (long)uVar40) {
            lVar27 = 0;
            do {
              puVar4 = (undefined8 *)((long)plVar23 + lVar27 + 0x20);
              uVar13 = puVar4[1];
              pBVar33 = pBVar29 + lVar27 + 0x20;
              *(undefined8 *)pBVar33 = *puVar4;
              *(undefined8 *)(pBVar33 + 8) = uVar13;
              puVar4 = (undefined8 *)((long)plVar23 + lVar27 + 0x30);
              uVar13 = puVar4[1];
              *(undefined8 *)(pBVar33 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar33 + 0x18) = uVar13;
              lVar27 = lVar27 + 0x20;
            } while (pBVar33 + 0x20 < pBVar29 + uVar40);
          }
          goto LAB_00186703;
        }
        seqStore->lit = pBVar29 + uVar40;
      }
      uVar19 = sVar18 + 4;
      psVar20 = seqStore->sequences;
      psVar20->litLength = (U16)uVar40;
      psVar20->offBase = 1;
      if (uVar19 < 3) goto LAB_0018727d;
      uVar40 = sVar18 + 1;
      uVar16 = local_104;
      if (uVar40 < 0x10000) goto LAB_00186de4;
      ZVar6 = seqStore->longLengthType;
joined_r0x00186c08:
      local_104 = uVar16;
      if (ZVar6 != ZSTD_llt_none) {
LAB_001872f9:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      UVar30 = (U16)uVar40;
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
    }
    src = (void *)(uVar19 + (long)plVar39);
    psVar20->mlBase = UVar30;
    seqStore->sequences = psVar20 + 1;
    plVar23 = (long *)src;
    if (src <= plVar3) {
      uVar35 = UVar34 + 2;
      plVar23 = (long *)(pBVar7 + uVar35);
      sVar18 = ZSTD_hash8Ptr(plVar23,uVar14);
      pUVar8[sVar18] = uVar35;
      sVar18 = ZSTD_hash8Ptr((void *)((long)src + -2),uVar14);
      pUVar8[sVar18] = (int)(void *)((long)src + -2) - iVar28;
      switch(uVar25) {
      case 0:
        pUVar9[(ulong)(*plVar23 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar35;
        uVar40 = *(long *)((long)src + -1) * -0x30e4432345000000;
        goto LAB_00186ee0;
      case 1:
        sVar18 = ZSTD_hash6Ptr(plVar23,h);
        pUVar9[sVar18] = uVar35;
        uVar40 = ZSTD_hash6Ptr((void *)((long)src + -1),h);
        break;
      case 2:
        pUVar9[(ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar35;
        uVar40 = *(long *)((long)src + -1) * -0x30e44323405a9d00;
LAB_00186ee0:
        uVar40 = uVar40 >> (bVar21 & 0x3f);
        break;
      case 3:
        sVar18 = ZSTD_hash8Ptr(plVar23,h);
        pUVar9[sVar18] = uVar35;
        uVar40 = ZSTD_hash8Ptr((void *)((long)src + -1),h);
        break;
      default:
        pUVar9[(uint)((int)*plVar23 * -0x61c8864f) >> (bVar22 & 0x1f)] = uVar35;
        uVar40 = (ulong)((uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar22 & 0x1f));
      }
      pUVar9[uVar40] = ((int)src + -1) - iVar28;
      UVar24 = UVar31;
      for (; UVar31 = UVar24, plVar23 = (long *)src, src <= plVar3;
          src = (void *)((long)src + sVar18 + 4)) {
        UVar24 = (int)src - iVar28;
        uVar35 = UVar24 - UVar31;
        pBVar29 = pBVar7;
        if (uVar35 < uVar5) {
          pBVar29 = pBVar10;
        }
        if (((UVar24 - uVar11 < UVar31) || ((uVar5 - 1) - uVar35 < 3)) ||
           (*(int *)(pBVar29 + uVar35) != (int)*src)) break;
        plVar23 = iEnd;
        if (uVar35 < uVar5) {
          plVar23 = plVar2;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar29 + uVar35) + 4),
                            (BYTE *)iEnd,(BYTE *)plVar23,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0018725e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001872da;
        op = (int *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < op) goto LAB_0018729c;
        if (iEnd < src) goto LAB_001872bb;
        if (ilimit_w < src) {
          ZSTD_safecopyLiterals((BYTE *)op,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
        }
        else {
          iVar37 = *(int *)((long)src + 4);
          lVar27 = *(long *)((long)src + 8);
          iVar12 = *(int *)((long)src + 0xc);
          *op = (int)*src;
          op[1] = iVar37;
          op[2] = (int)lVar27;
          op[3] = iVar12;
        }
        psVar20 = seqStore->sequences;
        psVar20->litLength = 0;
        psVar20->offBase = 1;
        if (sVar18 + 4 < 3) goto LAB_0018727d;
        if (0xffff < sVar18 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001872f9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar20->mlBase = (U16)(sVar18 + 1);
        seqStore->sequences = psVar20 + 1;
        if (mls - 5 < 4) {
          sVar18 = (*(code *)(&DAT_0024f3bc + *(int *)(&DAT_0024f3bc + uVar25 * 4)))();
          return sVar18;
        }
        pUVar9[(uint)((int)*src * -0x61c8864f) >> (bVar22 & 0x1f)] = UVar24;
        sVar17 = ZSTD_hash8Ptr(src,uVar14);
        pUVar8[sVar17] = UVar24;
        UVar24 = local_104;
        local_104 = UVar31;
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}